

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

char * __thiscall Options::match_longopt(Options *this,char *opt,int len,int *ambiguous)

{
  kwdmatch_t kVar1;
  char *pcVar2;
  int *in_RCX;
  OptionSpec *in_RDI;
  char *longopt;
  OptionSpec optspec;
  char **optv;
  char *matched;
  kwdmatch_t result;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  long *local_40;
  char *local_38;
  char *local_8;
  
  local_38 = (char *)0x0;
  *in_RCX = 0;
  if ((*(long *)(in_RDI + 1) == 0) || (**(long **)(in_RDI + 1) == 0)) {
    local_8 = (char *)0x0;
  }
  else {
    for (local_40 = *(long **)(in_RDI + 1); *local_40 != 0; local_40 = local_40 + 1) {
      OptionSpec::OptionSpec(in_RDI,in_stack_ffffffffffffff98);
      pcVar2 = OptionSpec::LongOpt(in_RDI);
      if (pcVar2 != (char *)0x0) {
        kVar1 = kwdmatch(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         (int)((ulong)pcVar2 >> 0x20));
        if (kVar1 == EXACT_MATCH) {
          pcVar2 = OptionSpec::operator_cast_to_char_(in_RDI);
          return pcVar2;
        }
        if (kVar1 == PARTIAL_MATCH) {
          if (local_38 != (char *)0x0) {
            *in_RCX = *in_RCX + 1;
            return (char *)0x0;
          }
          local_38 = OptionSpec::operator_cast_to_char_(in_RDI);
        }
      }
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

const char *
Options::match_longopt(const char * opt, int  len, int & ambiguous) const {
   kwdmatch_t  result;
   const char * matched = NULLSTR ;

   ambiguous = 0;
   if ((optvec == NULL) || (! *optvec))  return  NULLSTR;

   for (const char * const * optv = optvec ; *optv ; optv++) {
      OptionSpec  optspec = *optv;
      const char * longopt = optspec.LongOpt();
      if (longopt == NULL)  continue;
      result = kwdmatch(longopt, opt, len);
      if (result == EXACT_MATCH) {
         return  optspec;
      } else if (result == PARTIAL_MATCH) {
         if (matched) {
            ++ambiguous;
            return  NULLSTR;
         } else {
            matched = optspec;
         }
      }
   }//for

   return  matched;
}